

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_event.h
# Opt level: O3

void __thiscall
webrtc::trace_event_internal::TraceEndOnScopeClose::AddEventIfEnabled(TraceEndOnScopeClose *this)

{
  uchar *category_enabled;
  
  category_enabled = this->p_data_->category_enabled;
  if (*category_enabled != '\0') {
    EventTracer::AddTraceEvent
              ('E',category_enabled,this->p_data_->name,0,0,(char **)0x0,(uchar *)0x0,
               (unsigned_long_long *)0x0,'\0');
  }
  return;
}

Assistant:

void AddEventIfEnabled() {
    // Only called when p_data_ is non-null.
    if (*p_data_->category_enabled) {
      TRACE_EVENT_API_ADD_TRACE_EVENT(
          TRACE_EVENT_PHASE_END,
          p_data_->category_enabled,
          p_data_->name, kNoEventId,
          kZeroNumArgs, NULL, NULL, NULL,
          TRACE_EVENT_FLAG_NONE);
    }
  }